

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_sint64 PHYSFS_writeBytes(PHYSFS_File *handle,void *buffer,PHYSFS_uint64 _len)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  PHYSFS_sint64 PVar2;
  
  if ((long)_len < 0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    if (*(char *)&handle[1].opaque == '\0') {
      if (_len == 0) {
        return 0;
      }
      if (handle[3].opaque != (void *)0x0) {
        if ((void *)((long)handle[5].opaque + _len) < handle[4].opaque) {
          memcpy((void *)((long)handle[3].opaque + (long)handle[5].opaque),buffer,_len);
          handle[5].opaque = (void *)((long)handle[5].opaque + _len);
          return _len;
        }
        iVar1 = PHYSFS_flush(handle);
        if (iVar1 == 0) {
          return -1;
        }
      }
      PVar2 = (**(code **)((long)handle->opaque + 0x18))(handle->opaque,buffer,_len);
      return PVar2;
    }
    errcode = PHYSFS_ERR_OPEN_FOR_READING;
  }
  PHYSFS_setErrorCode(errcode);
  return -1;
}

Assistant:

PHYSFS_sint64 PHYSFS_writeBytes(PHYSFS_File *handle, const void *buffer,
                                PHYSFS_uint64 _len)
{
    const size_t len = (size_t) _len;
    FileHandle *fh = (FileHandle *) handle;

#ifdef PHYSFS_NO_64BIT_SUPPORT
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFF);
#else
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFFFFFFFFFF);
#endif

    if (!__PHYSFS_ui64FitsAddressSpace(_len))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, -1);

    BAIL_IF(_len > maxlen, PHYSFS_ERR_INVALID_ARGUMENT, -1);
    BAIL_IF(fh->forReading, PHYSFS_ERR_OPEN_FOR_READING, -1);
    BAIL_IF_ERRPASS(len == 0, 0);
    if (fh->buffer)
        return doBufferedWrite(handle, buffer, len);

    return fh->io->write(fh->io, buffer, len);
}